

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicsLinearization.cpp
# Opt level: O0

void iDynTree::ForwardDynamicsLinearizationWrtBaseTwist
               (Model *model,Traversal *traversal,FreeFloatingPos *robotPos,
               FreeFloatingVel *robotVel,LinkNetExternalWrenches *linkExtWrenches,
               JointDOFsDoubleArray *jointTorques,ForwardDynamicsLinearizationInternalBuffers *bufs,
               FreeFloatingAcc *robotAcc,FreeFloatingStateLinearization *A)

{
  IJoint *pIVar1;
  uint uVar2;
  int iVar3;
  Transform *pTVar4;
  JointPosDoubleArray *pJVar5;
  LinkIndex LVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VectorDynSize *this;
  undefined4 extraout_var_01;
  ArticulatedBodyInertia *pAVar7;
  double *pdVar8;
  size_type sVar9;
  Link *pLVar10;
  Traversal *other;
  size_t sVar11;
  size_type __n;
  size_type __n_00;
  FreeFloatingVel *in_RCX;
  FreeFloatingPos *in_RDX;
  Model *in_RDI;
  Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
  SVar12;
  long in_stack_00000008;
  size_t dofIndex_2;
  LinkIndex parentLinkIndex_2;
  IJointConstPtr toParentJoint_2;
  LinkConstPtr parentLink_2;
  LinkIndex visitedLinkIndex_2;
  LinkConstPtr visitedLink_2;
  uint traversalEl_2;
  Transform *parent_X_visited;
  LinkIndex parentLinkIndex_1;
  size_t dofIndex_1;
  ArticulatedBodyInertia Ia;
  Matrix6x6 dVb_pa;
  IJointConstPtr toParentJoint_1;
  LinkConstPtr parentLink_1;
  LinkIndex visitedLinkIndex_1;
  LinkConstPtr visitedLink_1;
  int traversalEl_1;
  SpatialMotionVector *S;
  double dql;
  size_t dofIndex;
  LinkIndex parentLinkIndex;
  IJointConstPtr toParentJoint;
  LinkConstPtr parentLink;
  LinkIndex visitedLinkIndex;
  LinkConstPtr visitedLink;
  uint traversalEl;
  Traversal *in_stack_ffffffffffffe5a8;
  Traversal *in_stack_ffffffffffffe5b0;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffe5b8;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,_6,_false>_>
  *in_stack_ffffffffffffe5c0;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffe5c8;
  MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_ffffffffffffe5d0;
  HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *in_stack_ffffffffffffe5d8;
  undefined4 in_stack_ffffffffffffe5f0;
  undefined4 in_stack_ffffffffffffe5f4;
  uint uVar13;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_ffffffffffffe5f8;
  SpatialForceVector *in_stack_ffffffffffffe638;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffe6d8;
  uint local_fc4;
  SpatialForceVector local_940 [216];
  ArticulatedBodyInertia local_868 [216];
  ulong local_790;
  ArticulatedBodyInertia local_788 [216];
  MatrixFixSize<6U,_6U> local_6b0;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *local_590;
  Link *local_588;
  size_type local_580;
  Link *local_578;
  uint local_56c;
  SpatialMotionVector local_2b8 [8];
  SpatialMotionVector *local_138;
  double local_130;
  ulong local_128;
  Transform local_120 [96];
  LinkIndex local_c0;
  Transform local_b8 [96];
  IJoint *local_58;
  Link *local_50;
  size_type local_48;
  Link *local_40;
  uint local_34;
  FreeFloatingVel *local_20;
  FreeFloatingPos *local_18;
  Model *local_8;
  undefined4 extraout_var_02;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_34 = 0; uVar13 = local_34,
      uVar2 = Traversal::getNrOfVisitedLinks((Traversal *)0x3cdd75), uVar13 < uVar2;
      local_34 = local_34 + 1) {
    local_40 = Traversal::getLink(in_stack_ffffffffffffe5b0,
                                  (TraversalIndex)in_stack_ffffffffffffe5a8);
    local_48 = Link::getIndex(local_40);
    local_50 = Traversal::getParentLink
                         (in_stack_ffffffffffffe5b0,(TraversalIndex)in_stack_ffffffffffffe5a8);
    local_58 = Traversal::getParentJoint
                         (in_stack_ffffffffffffe5b0,(TraversalIndex)in_stack_ffffffffffffe5a8);
    if (local_50 == (Link *)0x0) {
      iDynTree::Transform::Identity();
      pTVar4 = LinkPositions::operator()
                         ((LinkPositions *)in_stack_ffffffffffffe5b0,
                          (LinkIndex)in_stack_ffffffffffffe5a8);
      iDynTree::Transform::operator=(pTVar4,local_b8);
      std::
      vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
      ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    *)(in_stack_00000008 + 0x148),local_48);
      MatrixFixSize<6U,_6U>::zero((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5d0);
    }
    else {
      local_c0 = Link::getIndex(local_50);
      pIVar1 = local_58;
      pJVar5 = FreeFloatingPos::jointPos(local_18);
      sVar9 = local_48;
      LVar6 = Link::getIndex(local_50);
      iVar3 = (*pIVar1->_vptr_IJoint[10])(pIVar1,pJVar5,sVar9,LVar6);
      LinkPositions::operator()
                ((LinkPositions *)in_stack_ffffffffffffe5b0,(LinkIndex)in_stack_ffffffffffffe5a8);
      iDynTree::Transform::operator*(local_120,(Transform *)CONCAT44(extraout_var,iVar3));
      pTVar4 = LinkPositions::operator()
                         ((LinkPositions *)in_stack_ffffffffffffe5b0,
                          (LinkIndex)in_stack_ffffffffffffe5a8);
      iDynTree::Transform::operator=(pTVar4,local_120);
      iVar3 = (*local_58->_vptr_IJoint[4])();
      if (iVar3 == 0) {
        std::
        vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x148),local_48);
        MatrixFixSize<6U,_6U>::zero((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5d0);
      }
      else {
        iVar3 = (*local_58->_vptr_IJoint[0x18])();
        local_128 = CONCAT44(extraout_var_00,iVar3);
        this = &FreeFloatingVel::jointVel(local_20)->super_VectorDynSize;
        local_130 = (double)iDynTree::VectorDynSize::operator()(this,local_128);
        local_138 = DOFSpatialMotionArray::operator()
                              ((DOFSpatialMotionArray *)in_stack_ffffffffffffe5b0,
                               (size_t)in_stack_ffffffffffffe5a8);
        iDynTree::SpatialMotionVector::operator*(local_2b8,-local_130);
        iDynTree::SpatialMotionVector::asCrossProductMatrix();
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        LinkPositions::operator()
                  ((LinkPositions *)in_stack_ffffffffffffe5b0,(LinkIndex)in_stack_ffffffffffffe5a8);
        iDynTree::Transform::asAdjointTransform();
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>>::
        operator*((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_ffffffffffffe5c8,
                  (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_ffffffffffffe5c0);
        std::
        vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x148),local_48);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)
                   in_stack_ffffffffffffe5b0,
                   (DenseBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                    *)in_stack_ffffffffffffe5a8);
      }
    }
    std::
    vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
    ::operator[]((vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                  *)(in_stack_00000008 + 0x178),local_48);
    toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
    LinkPositions::operator()
              ((LinkPositions *)in_stack_ffffffffffffe5b0,(LinkIndex)in_stack_ffffffffffffe5a8);
    iDynTree::Transform::asAdjointTransform();
    toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::operator*
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_ffffffffffffe5c8,
               (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_ffffffffffffe5c0);
    std::
    vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
    ::operator[]((vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                  *)(in_stack_00000008 + 0x118),local_48);
    toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
    Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)
               in_stack_ffffffffffffe5b0,
               (DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                *)in_stack_ffffffffffffe5a8);
  }
  local_56c = Traversal::getNrOfVisitedLinks((Traversal *)0x3ce1b6);
  while( true ) {
    local_56c = local_56c - 1;
    SVar12.m_rhs = (Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)
                   in_stack_ffffffffffffe5d0;
    SVar12.m_dec = in_stack_ffffffffffffe5d8;
    if ((int)local_56c < 0) break;
    local_578 = Traversal::getLink(in_stack_ffffffffffffe5b0,
                                   (TraversalIndex)in_stack_ffffffffffffe5a8);
    local_580 = Link::getIndex(local_578);
    local_588 = Traversal::getParentLink
                          (in_stack_ffffffffffffe5b0,(TraversalIndex)in_stack_ffffffffffffe5a8);
    local_590 = (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                 *)Traversal::getParentJoint
                             (in_stack_ffffffffffffe5b0,(TraversalIndex)in_stack_ffffffffffffe5a8);
    if (local_588 != (Link *)0x0) {
      MatrixFixSize<6U,_6U>::MatrixFixSize(&local_6b0);
      iDynTree::ArticulatedBodyInertia::ArticulatedBodyInertia(local_788);
      iVar3 = (*(*(_func_int ***)local_590)[4])();
      if (iVar3 != 0) {
        iVar3 = (*(*(_func_int ***)local_590)[0x18])();
        local_790 = CONCAT44(extraout_var_01,iVar3);
        pAVar7 = LinkArticulatedBodyInertias::operator()
                           ((LinkArticulatedBodyInertias *)in_stack_ffffffffffffe5b0,
                            (LinkIndex)in_stack_ffffffffffffe5a8);
        DOFSpatialForceArray::operator()
                  ((DOFSpatialForceArray *)in_stack_ffffffffffffe5b0,
                   (size_t)in_stack_ffffffffffffe5a8);
        pdVar8 = (double *)
                 iDynTree::VectorDynSize::operator()
                           ((VectorDynSize *)(in_stack_00000008 + 0x30),local_790);
        iDynTree::ArticulatedBodyInertia::ABADyadHelper(local_940,*pdVar8);
        iDynTree::ArticulatedBodyInertia::operator-(local_868,pAVar7);
        memcpy(local_788,local_868,0xd8);
        DOFSpatialMotionArray::operator()
                  ((DOFSpatialMotionArray *)in_stack_ffffffffffffe5b0,
                   (size_t)in_stack_ffffffffffffe5a8);
        toEigen((SpatialMotionVector *)in_stack_ffffffffffffe638);
        Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::transpose
                  ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffe5a8);
        Eigen::DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>::operator-
                  ((DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_> *)
                   in_stack_ffffffffffffe5c8);
        std::
        vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x118),local_580);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::
        MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>const>const>>
        ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                     *)in_stack_ffffffffffffe5c8,
                    (MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_ffffffffffffe5c0);
        std::
        vector<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>::
        operator[]((vector<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>
                    *)(in_stack_00000008 + 0x130),local_790);
        toEigen<6U>((MatrixFixSize<1U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::Map<Eigen::Matrix<double,1,6,1,1,6>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_> *)
                   in_stack_ffffffffffffe5b0,
                   (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                    *)in_stack_ffffffffffffe5a8);
        std::
        vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x118),local_580);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        iDynTree::ArticulatedBodyInertia::asMatrix();
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        std::
        vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x148),local_580);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>>::
        operator*((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_ffffffffffffe5c8,
                  (MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_ffffffffffffe5c0);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::
        operator+((MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
        DOFSpatialForceArray::operator()
                  ((DOFSpatialForceArray *)in_stack_ffffffffffffe5b0,
                   (size_t)in_stack_ffffffffffffe5a8);
        toEigen(in_stack_ffffffffffffe638);
        std::
        vector<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>::
        operator[]((vector<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>
                    *)(in_stack_00000008 + 0x130),local_790);
        toEigen<6U>((MatrixFixSize<1U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffe5c8,
                   (MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_>_>
                    *)in_stack_ffffffffffffe5c0);
        iDynTree::VectorDynSize::operator()((VectorDynSize *)(in_stack_00000008 + 0x30),local_790);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Map<Eigen::Matrix<double,1,6,1,1,6>,0,Eigen::Stride<0,0>>,0>>
        ::operator/(in_stack_ffffffffffffe5f8,
                    (double *)CONCAT44(in_stack_ffffffffffffe5f4,in_stack_ffffffffffffe5f0));
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>const>>
        ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>_>
                     *)in_stack_ffffffffffffe5d8,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>_>
                     *)in_stack_ffffffffffffe5d0);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)
                   in_stack_ffffffffffffe5b0,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>_>_>
                    *)in_stack_ffffffffffffe5a8);
      }
      iVar3 = (*(*(_func_int ***)local_590)[4])();
      if (iVar3 == 0) {
        pAVar7 = LinkArticulatedBodyInertias::operator()
                           ((LinkArticulatedBodyInertias *)in_stack_ffffffffffffe5b0,
                            (LinkIndex)in_stack_ffffffffffffe5a8);
        memcpy(local_788,pAVar7,0xd8);
        std::
        vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x118),local_580);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        iDynTree::ArticulatedBodyInertia::asMatrix();
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        std::
        vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x148),local_580);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>>::
        operator*((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_ffffffffffffe5c8,
                  (MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_ffffffffffffe5c0);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::
        operator+((MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)
                   in_stack_ffffffffffffe5b0,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>_>
                    *)in_stack_ffffffffffffe5a8);
      }
      sVar9 = Link::getIndex(local_588);
      in_stack_ffffffffffffe5f8 = local_590;
      pJVar5 = FreeFloatingPos::jointPos(local_18);
      (*(*(_func_int ***)in_stack_ffffffffffffe5f8)[10])
                (in_stack_ffffffffffffe5f8,pJVar5,sVar9,local_580);
      iDynTree::Transform::asAdjointTransformWrench();
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>>::
      operator*((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_ffffffffffffe5c8,
                (MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_ffffffffffffe5c0);
      std::
      vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
      ::operator[]((vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                    *)(in_stack_00000008 + 0x118),sVar9);
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::
      operator+=((MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_stack_ffffffffffffe5d0,
                 (MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                  *)in_stack_ffffffffffffe5c8);
    }
  }
  local_fc4 = 0;
  while (uVar13 = local_fc4, uVar2 = Traversal::getNrOfVisitedLinks((Traversal *)0x3ce80f),
        uVar13 < uVar2) {
    pLVar10 = Traversal::getLink(in_stack_ffffffffffffe5b0,(TraversalIndex)in_stack_ffffffffffffe5a8
                                );
    sVar9 = Link::getIndex(pLVar10);
    pLVar10 = Traversal::getParentLink
                        (in_stack_ffffffffffffe5b0,(TraversalIndex)in_stack_ffffffffffffe5a8);
    other = (Traversal *)
            Traversal::getParentJoint
                      (in_stack_ffffffffffffe5b0,(TraversalIndex)in_stack_ffffffffffffe5a8);
    if (pLVar10 == (Link *)0x0) {
      LinkArticulatedBodyInertias::operator()
                ((LinkArticulatedBodyInertias *)in_stack_ffffffffffffe5b0,
                 (LinkIndex)in_stack_ffffffffffffe5a8);
      iDynTree::ArticulatedBodyInertia::asMatrix();
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
      Eigen::
      MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>::
      householderQr(in_stack_ffffffffffffe6d8);
      std::
      vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
      ::operator[]((vector<iDynTree::SpatialForceWrtMotionDerivative,_std::allocator<iDynTree::SpatialForceWrtMotionDerivative>_>
                    *)(in_stack_00000008 + 0x118),sVar9);
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
      SVar12 = Eigen::SolverBase<Eigen::HouseholderQR<Eigen::Matrix<double,6,6,1,6,6>>>::
               solve<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>
                         ((SolverBase<Eigen::HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
                           *)in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8);
      Eigen::
      DenseBase<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>_>
      ::operator-((DenseBase<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>_>
                   *)in_stack_ffffffffffffe5c8);
      std::
      vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
      ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    *)(in_stack_00000008 + 0x160),sVar9);
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
      Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)
                 in_stack_ffffffffffffe5b0,
                 (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>_>_>
                  *)in_stack_ffffffffffffe5a8);
      Eigen::HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::~HouseholderQR
                ((HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)0x3ce9c7);
      std::
      vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
      ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                    *)(in_stack_00000008 + 0x160),sVar9);
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
      toEigen((MatrixDynSize *)SVar12.m_dec);
      sVar11 = Model::getNrOfDOFs(local_8);
      in_stack_ffffffffffffe5c8 =
           (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
            *)(sVar11 + 6);
      Model::getNrOfDOFs(local_8);
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
      block<6,6>(in_stack_ffffffffffffe5c8,(Index)in_stack_ffffffffffffe5c0,
                 (Index)in_stack_ffffffffffffe5b8);
      Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,6,6,false>::
      operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_6,_6,_false>
                 *)in_stack_ffffffffffffe5b0,
                (DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_ffffffffffffe5a8);
      other = in_stack_ffffffffffffe5a8;
    }
    else {
      __n = Link::getIndex(pLVar10);
      iVar3 = (*(code *)(other->links).
                        super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[4])();
      if (iVar3 == 0) {
        pJVar5 = FreeFloatingPos::jointPos(local_18);
        (*(code *)(other->links).
                  super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[10])(other,pJVar5,sVar9,__n);
        iDynTree::Transform::asAdjointTransform();
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        std::
        vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x160),__n);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>>::
        operator*((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_ffffffffffffe5c8,
                  (MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_ffffffffffffe5c0);
        std::
        vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x148),sVar9);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>>
        ::operator+((MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                     *)SVar12.m_dec,
                    (MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                     *)SVar12.m_rhs);
        std::
        vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x160),sVar9);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)
                   in_stack_ffffffffffffe5b0,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)other);
      }
      else {
        iVar3 = (*(code *)(other->links).
                          super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x18])();
        __n_00 = CONCAT44(extraout_var_02,iVar3);
        pJVar5 = FreeFloatingPos::jointPos(local_18);
        (*(code *)(other->links).
                  super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[10])(other,pJVar5,sVar9,__n);
        iDynTree::Transform::asAdjointTransform();
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        std::
        vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x160),__n);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>>::
        operator*((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_ffffffffffffe5c8,
                  (MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_ffffffffffffe5c0);
        std::
        vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x148),sVar9);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>>
        ::operator+((MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                     *)SVar12.m_dec,
                    (MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                     *)SVar12.m_rhs);
        std::
        vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x160),sVar9);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)other,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)in_stack_ffffffffffffe5a8);
        std::
        vector<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>::
        operator[]((vector<iDynTree::MatrixFixSize<1U,_6U>,_std::allocator<iDynTree::MatrixFixSize<1U,_6U>_>_>
                    *)(in_stack_00000008 + 0x130),__n_00);
        toEigen<6U>((MatrixFixSize<1U,_6U> *)in_stack_ffffffffffffe5c8);
        DOFSpatialForceArray::operator()
                  ((DOFSpatialForceArray *)other,(size_t)in_stack_ffffffffffffe5a8);
        toEigen(in_stack_ffffffffffffe638);
        Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::transpose
                  ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffe5a8);
        std::
        vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x160),sVar9);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>const>>::operator*
                  ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_> *)
                   in_stack_ffffffffffffe5c8,
                   (MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                    *)in_stack_ffffffffffffe5c0);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,1,6,1,1,6>,0,Eigen::Stride<0,0>>>::
        operator-((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)SVar12.m_dec,
                  (MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                   *)SVar12.m_rhs);
        iDynTree::VectorDynSize::operator()((VectorDynSize *)(in_stack_00000008 + 0x30),__n_00);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,1,6,1,1,6>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>const>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>const>>
        ::operator/((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>_>
                     *)in_stack_ffffffffffffe5f8,
                    (double *)CONCAT44(uVar13,in_stack_ffffffffffffe5f0));
        toEigen((MatrixDynSize *)SVar12.m_dec);
        sVar11 = Model::getNrOfDOFs(local_8);
        in_stack_ffffffffffffe5b8 =
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
              *)(sVar11 + 0xc + __n_00);
        Model::getNrOfDOFs(local_8);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
        block<1,6>(in_stack_ffffffffffffe5c8,(Index)in_stack_ffffffffffffe5c0,
                   (Index)in_stack_ffffffffffffe5b8);
        Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,1,6,false>
        ::operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,_6,_false>
                     *)other,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_6,_1,_1,_6>_>_>_>
                              *)in_stack_ffffffffffffe5a8);
        std::
        vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x160),sVar9);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        DOFSpatialMotionArray::operator()
                  ((DOFSpatialMotionArray *)other,(size_t)in_stack_ffffffffffffe5a8);
        toEigen((SpatialMotionVector *)in_stack_ffffffffffffe638);
        toEigen((MatrixDynSize *)SVar12.m_dec);
        sVar11 = Model::getNrOfDOFs(local_8);
        in_stack_ffffffffffffe5c0 =
             (MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,_6,_false>_>
              *)(sVar11 + 0xc + __n_00);
        Model::getNrOfDOFs(local_8);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
        block<1,6>(in_stack_ffffffffffffe5c8,(Index)in_stack_ffffffffffffe5c0,
                   (Index)in_stack_ffffffffffffe5b8);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffe5c8,
                   in_stack_ffffffffffffe5c0);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::
        operator+((MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                   *)SVar12.m_dec,
                  (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,_6,_false>,_0>_>
                   *)SVar12.m_rhs);
        std::
        vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
        ::operator[]((vector<iDynTree::SpatialMotionWrtMotionDerivative,_std::allocator<iDynTree::SpatialMotionWrtMotionDerivative>_>
                      *)(in_stack_00000008 + 0x160),sVar9);
        toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_ffffffffffffe5c8);
        in_stack_ffffffffffffe5b0 = other;
        Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)other,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,_6,_false>,_0>_>_>
                    *)in_stack_ffffffffffffe5a8);
        other = in_stack_ffffffffffffe5a8;
      }
    }
    local_fc4 = local_fc4 + 1;
    in_stack_ffffffffffffe5a8 = other;
  }
  return;
}

Assistant:

void ForwardDynamicsLinearizationWrtBaseTwist(const Model& model,
                                              const Traversal& traversal,
                                              const FreeFloatingPos& robotPos,
                                              const FreeFloatingVel& robotVel,
                                              const LinkNetExternalWrenches& linkExtWrenches,
                                              const JointDOFsDoubleArray& jointTorques,
                                              ForwardDynamicsLinearizationInternalBuffers & bufs,
                                              FreeFloatingAcc& robotAcc,
                                              FreeFloatingStateLinearization& A)
{
    //std::cout << "ForwardDynamicsLinearizationWrtBaseTwist A : " << A.toString() << std::endl;
    /**
     * Forward pass: compute the derivatives of  link velocities and of link bias accelerations
     * with respect to the base twist.
     * In particur, the derivative of the linkVelocity[l] with respect to the base velocity
     * is just the \f$ ~^b X_l \f$ transform, so we just compute that transform for the derivative
     * of link velocity with respect to base velocity.
     * We don't such a strong structure for the derivative with respect to the link bias acceleration,
     * so store it as a 6x6 matrix.
     */
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        // Propagate the derivatives of velocities and bias accelerations

        // If the visitedLink is the base one, initialize the derivative of the link velocity
        // with respect to the base velocity to identiy
        if( parentLink == 0 )
        {
            bufs.linkPos(visitedLinkIndex) = iDynTree::Transform::Identity();
            bufs.dVb_linkBiasAcceleration[visitedLinkIndex].zero();
        }
        else
        {
            LinkIndex    parentLinkIndex = parentLink->getIndex();
            bufs.linkPos(visitedLinkIndex) =
                    toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLink->getIndex())*bufs.linkPos(parentLinkIndex);

            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                bufs.dVb_linkBiasAcceleration[visitedLinkIndex].zero();
            }
            else
            {
               size_t dofIndex = toParentJoint->getDOFsOffset();
               double dql      = robotVel.jointVel()(dofIndex);
               iDynTree::SpatialMotionVector & S = bufs.aba.S(dofIndex);

               toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]) = toEigen((S*(-dql)).asCrossProductMatrix())*toEigen( bufs.linkPos(visitedLinkIndex).asAdjointTransform());
            }
        }

       //std::cout << " dVl_linkLocalBiasWrench : " << bufs.dVl_linkLocalBiasWrench[visitedLinkIndex].toString() << std::endl;
       toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex]) = toEigen(bufs.dVl_linkLocalBiasWrench[visitedLinkIndex])*toEigen( bufs.linkPos(visitedLinkIndex).asAdjointTransform());


    }

    /*
     * Backward pass: recursivly compute
     * the derivative of articulated body bias wrench
     * with respect to the base velocity.
     *
     */
    for(int traversalEl = traversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);


        if( parentLink )
        {
            // For now we support only 0 and 1 dof joints
            Matrix6x6 dVb_pa;
            ArticulatedBodyInertia Ia;

            // for 1 dof joints, the articulated inertia
            // need to be propagated to the parent considering
            // the joints
            if( toParentJoint->getNrOfDOFs() > 0 )
            {
                assert(toParentJoint->getNrOfDOFs()==1);
                size_t dofIndex = toParentJoint->getDOFsOffset();

                Ia = bufs.aba.linkABIs(visitedLinkIndex)
                    - ArticulatedBodyInertia::ABADyadHelper(bufs.aba.U(dofIndex),bufs.aba.D(dofIndex));

                toEigen(bufs.dVb_u[dofIndex]) = -toEigen(bufs.aba.S(dofIndex)).transpose()*toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex]);
                toEigen(dVb_pa)  =  toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex])
                                     + toEigen(Ia.asMatrix())*toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex])
                                     + toEigen(bufs.aba.U(dofIndex))*toEigen(bufs.dVb_u[dofIndex])/bufs.aba.D(dofIndex);

            }

            // For fixed joints, we just need to propate
            // the articulated quantities without considering the
            // joint
            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                Ia = bufs.aba.linkABIs(visitedLinkIndex);
                toEigen(dVb_pa)   =  toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex])
                                     + toEigen(Ia.asMatrix())*toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]);
            }

            // Propagate
            LinkIndex parentLinkIndex = parentLink->getIndex();
            const Transform & parent_X_visited = toParentJoint->getTransform(robotPos.jointPos(),parentLinkIndex,visitedLinkIndex);
            toEigen(bufs.dVb_linkBiasWrench[parentLinkIndex]) += toEigen(parent_X_visited.asAdjointTransformWrench())*toEigen(dVb_pa);
        }
    }


    /**
     * Second forward pass: find robot accelerations
     *
     */
    // \todo TODO Handle gravity
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
       LinkConstPtr visitedLink = traversal.getLink(traversalEl);
       LinkIndex visitedLinkIndex = visitedLink->getIndex();
       LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
       IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

       if( parentLink == 0 )
       {
           // Preliminary step: find base acceleration
           //std::cout << "bufs.dVb_linkBiasWrench : "<<  bufs.dVb_linkBiasWrench[visitedLinkIndex].toString() << std::endl;
           toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) = -toEigen(bufs.aba.linkABIs(visitedLinkIndex).asMatrix()).householderQr().solve(toEigen(bufs.dVb_linkBiasWrench[visitedLinkIndex]));
           // Start storing the result in the linearization matrix
           toEigen(A).block<6,6>(6+model.getNrOfDOFs(),6+model.getNrOfDOFs()) = toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]);
           /*
           std::cout << "Acceleration setted : " << std::endl;
           std::cout << toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) << std::endl;
           std::cout << "Resulting A " << std::endl;
           */
        }
       else
       {
           LinkIndex    parentLinkIndex = parentLink->getIndex();
           if( toParentJoint->getNrOfDOFs() > 0 )
           {
               size_t dofIndex = toParentJoint->getDOFsOffset();
               assert(toParentJoint->getNrOfDOFs()==1);
               toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) =
                   toEigen(toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex).asAdjointTransform())*toEigen(bufs.dVb_linksAccelerations[parentLinkIndex])
                   + toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]);
               toEigen(A).block<1,6>(6+model.getNrOfDOFs()+6+dofIndex,6+model.getNrOfDOFs())  = (toEigen(bufs.dVb_u[dofIndex]) - toEigen(bufs.aba.U(dofIndex)).transpose()*toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]))/bufs.aba.D(dofIndex);
               toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) = toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) + toEigen(bufs.aba.S(dofIndex))*toEigen(A).block<1,6>(6+model.getNrOfDOFs()+6+dofIndex,6+model.getNrOfDOFs());
           }
           else
           {
               //for fixed joints we just propagate the acceleration
               toEigen(bufs.dVb_linksAccelerations[visitedLinkIndex]) =
                   toEigen(toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex).asAdjointTransform())*toEigen(bufs.dVb_linksAccelerations[parentLinkIndex])
                   + toEigen(bufs.dVb_linkBiasAcceleration[visitedLinkIndex]);
           }
       }
    }
}